

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

void __thiscall graphics101::Texture2D::reload(Texture2D *this)

{
  pair<int,_int> pVar1;
  int local_18;
  int iStack_14;
  pair<int,_int> width_height;
  Texture2D *this_local;
  
  (*gl3wProcs.ptr[0x16])(0xde1,(ulong)(this->super_Texture).m_textureName);
  (*gl3wProcs.ptr[0x1da])(0xde1,0x2802,0x812f);
  (*gl3wProcs.ptr[0x1da])(0xde1,0x2803,0x812f);
  (*gl3wProcs.ptr[0x1da])(0xde1,0x2800,0x2601);
  (*gl3wProcs.ptr[0x1da])(0xde1,0x2801,0x2601);
  (*gl3wProcs.ptr[0x1da])(0xde1,0x813c,0);
  (*gl3wProcs.ptr[0x1da])(0xde1,0x813d,0);
  pVar1 = anon_unknown.dwarf_ff589::upload_image(0xde1,&this->m_image_path,true);
  local_18 = pVar1.first;
  *(int *)&(this->super_Texture).field_0xc = local_18;
  iStack_14 = pVar1.second;
  this->height = iStack_14;
  return;
}

Assistant:

void Texture2D::reload()
{
    glBindTexture( GL_TEXTURE_2D, m_textureName );
    
    // Set common parameters. We're not using mip-mapping.
    // From: https://www.khronos.org/opengl/wiki/Common_Mistakes#Creating_a_complete_texture
    
    // Set common parameters.
    glTexParameteri( GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE );
    glTexParameteri( GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE );
    glTexParameteri( GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR );
    glTexParameteri( GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR );
    glTexParameteri( GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, 0 );
    glTexParameteri( GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL,  0 );
    
    // Upload data.
    // TODO: If we know that the new and old data are the same size, we could use glTexSubImage2D();
    const auto width_height = upload_image( GL_TEXTURE_2D, m_image_path, true );
    width = width_height.first;
    height = width_height.second;
}